

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void_(const_std::error_code_&,_unsigned_long)>::
callable_impl<void,_cppcms::impl::cgi::fastcgi::io_handler_to_event_handler>::callable_impl
          (callable_impl<void,_cppcms::impl::cgi::fastcgi::io_handler_to_event_handler> *this,
          io_handler_to_event_handler *f)

{
  callable<void_(const_std::error_code_&,_unsigned_long)> *in_RDI;
  io_handler_to_event_handler *in_stack_ffffffffffffffc8;
  
  callable<void_(const_std::error_code_&,_unsigned_long)>::callable(in_RDI);
  (in_RDI->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__callable_impl_00530828;
  cppcms::impl::cgi::fastcgi::io_handler_to_event_handler::io_handler_to_event_handler
            ((io_handler_to_event_handler *)in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

callable_impl(F f) : func(f){}